

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2e8cd18::PeerManagerImpl::Misbehaving
          (PeerManagerImpl *this,Peer *peer,string *message)

{
  long lVar1;
  bool bVar2;
  Logger *this_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock37;
  string message_prefixed;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock37.super_unique_lock._M_device = (mutex_type *)&(this->m_rng).rng;
  criticalblock37.super_unique_lock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&criticalblock37.super_unique_lock);
  if (peer->m_our_services == NODE_NONE) {
    message_prefixed._M_dataplus._M_p = (pointer)&message_prefixed.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&message_prefixed,"");
  }
  else {
    std::operator+(&message_prefixed,": ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)peer);
  }
  *(undefined1 *)((this->m_rng).rng.m_aligned.input + 10) = 1;
  this_00 = LogInstance();
  bVar2 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
  if (bVar2) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
    ;
    source_file._M_len = 0x62;
    logging_function._M_str = "Misbehaving";
    logging_function._M_len = 0xb;
    LogPrintFormatInternal<long,std::__cxx11::string>
              (logging_function,source_file,0x798,NET,Debug,(ConstevalFormatString<2U>)0xf7b116,
               (long *)this,&message_prefixed);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)message_prefixed._M_dataplus._M_p != &message_prefixed.field_2) {
    operator_delete(message_prefixed._M_dataplus._M_p,
                    message_prefixed.field_2._M_allocated_capacity + 1);
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock37.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::Misbehaving(Peer& peer, const std::string& message)
{
    LOCK(peer.m_misbehavior_mutex);

    const std::string message_prefixed = message.empty() ? "" : (": " + message);
    peer.m_should_discourage = true;
    LogDebug(BCLog::NET, "Misbehaving: peer=%d%s\n", peer.m_id, message_prefixed);
}